

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *enumNode,Reader *replacement)

{
  ListElementCount LVar1;
  int iVar2;
  bool bVar3;
  PointerReader local_78;
  ListReader local_50;
  
  bVar3 = (enumNode->_reader).pointerCount < 4;
  local_78.pointer = (enumNode->_reader).pointers + 3;
  if (bVar3) {
    local_78.pointer = (WirePointer *)0x0;
  }
  iVar2 = 0x7fffffff;
  local_78.nestingLimit = (enumNode->_reader).nestingLimit;
  if (bVar3) {
    local_78.nestingLimit = 0x7fffffff;
    local_78.segment._0_4_ = 0;
    local_78.segment._4_4_ = 0;
    local_78.capTable._0_4_ = 0;
    local_78.capTable._4_4_ = 0;
  }
  else {
    local_78.segment._0_4_ = *(undefined4 *)&(enumNode->_reader).segment;
    local_78.segment._4_4_ = *(undefined4 *)((long)&(enumNode->_reader).segment + 4);
    local_78.capTable._0_4_ = *(undefined4 *)&(enumNode->_reader).capTable;
    local_78.capTable._4_4_ = *(undefined4 *)((long)&(enumNode->_reader).capTable + 4);
  }
  capnp::_::PointerReader::getList(&local_50,&local_78,INLINE_COMPOSITE,(word *)0x0);
  LVar1 = local_50.elementCount;
  bVar3 = 3 < (replacement->_reader).pointerCount;
  local_78.pointer = (WirePointer *)0x0;
  if (bVar3) {
    iVar2 = (replacement->_reader).nestingLimit;
    local_78.pointer = (replacement->_reader).pointers + 3;
  }
  local_78.segment._0_4_ = 0;
  local_78.segment._4_4_ = 0;
  local_78.capTable._0_4_ = 0;
  local_78.capTable._4_4_ = 0;
  if (bVar3) {
    local_78.segment._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
    local_78.segment._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
    local_78.capTable._0_4_ = *(undefined4 *)&(replacement->_reader).capTable;
    local_78.capTable._4_4_ = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
  }
  local_78.nestingLimit = iVar2;
  capnp::_::PointerReader::getList(&local_50,&local_78,INLINE_COMPOSITE,(word *)0x0);
  if (LVar1 < local_50.elementCount) {
    replacementIsNewer(this);
  }
  else if (local_50.elementCount < LVar1) {
    replacementIsOlder(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Enum::Reader& enumNode,
                          const schema::Node::Enum::Reader& replacement) {
    uint size = enumNode.getEnumerants().size();
    uint replacementSize = replacement.getEnumerants().size();
    if (replacementSize > size) {
      replacementIsNewer();
    } else if (replacementSize < size) {
      replacementIsOlder();
    }
  }